

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_IsHiddenSectionDefault::Run(void)

{
  TemplateString TVar1;
  bool bVar2;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"UNDEFINED");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_d0);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.IsHiddenSection(\"UNDEFINED\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_f0,"UNDEFINED");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsUnhiddenSection(&local_a0,&local_f0);
  if (bVar2) {
    fprintf(_stderr,"Check failed: %s\n","!(peer.IsUnhiddenSection(\"UNDEFINED\"))");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_110,"VISIBLE");
  TVar1.length_ = local_110.length_;
  TVar1.ptr_ = local_110.ptr_;
  TVar1.is_immutable_ = local_110.is_immutable_;
  TVar1._17_7_ = local_110._17_7_;
  TVar1.id_ = local_110.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar1);
  ctemplate::TemplateString::TemplateString(&local_130,"VISIBLE");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_130);
  if (bVar2) {
    fprintf(_stderr,"Check failed: %s\n","!(peer.IsHiddenSection(\"VISIBLE\"))");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_150,"VISIBLE");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsUnhiddenSection(&local_a0,&local_150);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","peer.IsUnhiddenSection(\"VISIBLE\")");
  exit(1);
}

Assistant:

TEST(TemplateDictionary, IsHiddenSectionDefault) {
  TemplateDictionary dict("dict");
  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.IsHiddenSection("UNDEFINED"));
  EXPECT_FALSE(peer.IsUnhiddenSection("UNDEFINED"));
  dict.ShowSection("VISIBLE");
  EXPECT_FALSE(peer.IsHiddenSection("VISIBLE"));
  EXPECT_TRUE(peer.IsUnhiddenSection("VISIBLE"));
}